

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArray<char,_false,_false>::TypedXor
          (TypedArray<char,_false,_false> *this,uint32 accessIndex,Var value)

{
  ArrayBufferBase *pAVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  int8 value_00;
  char cVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  
  pAVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  if (pAVar1 == (ArrayBufferBase *)0x0) {
LAB_00c01d41:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(GetArrayBuffer() && GetArrayBuffer()->GetBuffer())",
                                "GetArrayBuffer() && GetArrayBuffer()->GetBuffer()");
    if (!bVar4) goto LAB_00c01e26;
    *puVar7 = 0;
  }
  else {
    iVar6 = (*(pAVar1->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
    if (CONCAT44(extraout_var,iVar6) == 0) goto LAB_00c01d41;
  }
  if ((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length <= accessIndex)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(accessIndex < GetLength())","accessIndex < GetLength()");
    if (!bVar4) {
LAB_00c01e26:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  puVar2 = (this->super_TypedArrayBase).buffer;
  value_00 = JavascriptConversion::ToInt8
                       (value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.
                                  super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.
                                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                              scriptContext.ptr);
  cVar5 = AtomicsOperations::Xor<char>((char *)(puVar2 + accessIndex),value_00);
  return (Var)((ulong)(uint)(int)cVar5 | 0x1000000000000);
}

Assistant:

VTableValue Int8Array::DummyVirtualFunctionToHinderLinkerICF()
    {
        return VTableValue::VtableInt8Array;
    }